

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<int,int>::
Flush<duckdb::BitpackingCompressionState<int,true,int>::BitpackingWriter>
          (BitpackingState<int,int> *this)

{
  BitpackingState<int,int> *pBVar1;
  int *piVar2;
  idx_t iVar3;
  int *values;
  bool bVar4;
  uint uVar5;
  BitpackingState<int,int> BVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  unsigned_long uVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  idx_t iVar14;
  bool bVar15;
  uint uVar16;
  int left;
  ulong uVar17;
  
  bVar15 = true;
  if (*(idx_t *)(this + 0x4810) == 0) {
    return true;
  }
  if (this[0x4845] == (BitpackingState<int,int>)0x0) {
    iVar8 = *(int *)(this + 0x4828);
    left = *(int *)(this + 0x482c);
    if (left != iVar8) goto LAB_01721d46;
  }
  left = *(int *)(this + 0x482c);
  if ((byte)((char)this[0x4848] - 1U) < 2) {
    BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteConstant
              (left,*(idx_t *)(this + 0x4810),*(void **)(this + 0x4820),(bool)this[0x4845]);
    *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 8;
    return true;
  }
  iVar8 = *(int *)(this + 0x4828);
LAB_01721d46:
  pBVar1 = this + 0x4830;
  BVar6 = (BitpackingState<int,int>)
          TrySubtractOperator::Operation<int,int,int>(left,iVar8,(int32_t *)pBVar1);
  this[0x4847] = BVar6;
  BitpackingState<int,_int>::CalculateDeltaStats((BitpackingState<int,_int> *)this);
  if (this[0x4846] == (BitpackingState<int,int>)0x1) {
    iVar8 = *(int *)(this + 0x4834);
    if ((*(int *)(this + 0x4838) == iVar8) && (((byte)this[0x4848] & 0xfe) != 4)) {
      BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteConstantDelta
                (*(int *)(this + 0x4838),**(int **)(this + 0x2008),*(idx_t *)(this + 0x4810),
                 *(int **)(this + 0x2008),(bool *)(this + 0x4010),*(void **)(this + 0x4820));
      *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 0xc;
      return true;
    }
    if (*(uint *)(this + 0x483c) == 0) {
      bVar7 = 0;
    }
    else {
      bVar11 = 0;
      uVar16 = *(uint *)(this + 0x483c);
      do {
        bVar11 = bVar11 + 1;
        bVar4 = 1 < uVar16;
        uVar16 = (int)uVar16 >> 1;
      } while (bVar4);
      bVar7 = 0x20;
      if (bVar11 < 0x1d) {
        bVar7 = bVar11;
      }
    }
    uVar16 = *(uint *)pBVar1;
    if (uVar16 == 0) {
      bVar13 = 0;
    }
    else {
      uVar5 = -uVar16;
      if (0 < (int)uVar16) {
        uVar5 = uVar16;
      }
      uVar17 = (ulong)uVar5;
      bVar11 = 0;
      do {
        bVar12 = bVar11;
        uVar17 = uVar17 >> 1;
        bVar11 = bVar12 + 1;
        bVar4 = 1 < uVar5;
        uVar5 = (uint)uVar17;
      } while (bVar4);
      bVar13 = 0x20;
      if (bVar11 < 0x1c) {
        bVar13 = bVar12 + 2;
      }
    }
    if ((bVar7 < bVar13) && (this[0x4848] != (BitpackingState<int,int>)0x5)) {
      pBVar1 = this + 0x2010;
      iVar3 = *(idx_t *)(this + 0x4810);
      if (iVar3 != 0) {
        iVar14 = 0;
        do {
          *(int *)(pBVar1 + iVar14 * 4) = *(int *)(pBVar1 + iVar14 * 4) - iVar8;
          iVar14 = iVar14 + 1;
        } while (iVar3 != iVar14);
        iVar8 = *(int *)(this + 0x4834);
      }
      BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteDeltaFor
                ((int *)pBVar1,(bool *)(this + 0x4010),bVar7,iVar8,*(int *)(this + 0x4840),
                 *(int **)(this + 0x2008),iVar3,*(void **)(this + 0x4820));
      uVar17 = *(ulong *)(this + 0x4810);
      lVar9 = *(long *)(this + 0x4818) + 0x10;
      *(long *)(this + 0x4818) = lVar9;
      if ((uVar17 & 0x1f) != 0) {
        uVar10 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar17 & 0x1f);
        uVar17 = (uVar17 - uVar10) + 0x20;
        lVar9 = *(long *)(this + 0x4818);
      }
      *(ulong *)(this + 0x4818) = (bVar7 * uVar17 >> 3) + lVar9;
      return true;
    }
  }
  if (this[0x4847] == (BitpackingState<int,int>)0x1) {
    if (*(uint *)pBVar1 == 0) {
      bVar7 = 0;
    }
    else {
      bVar11 = 0;
      uVar16 = *(uint *)pBVar1;
      do {
        bVar11 = bVar11 + 1;
        bVar4 = 1 < uVar16;
        uVar16 = (int)uVar16 >> 1;
      } while (bVar4);
      bVar7 = 0x20;
      if (bVar11 < 0x1d) {
        bVar7 = bVar11;
      }
    }
    values = *(int **)(this + 0x2008);
    iVar8 = *(int *)(this + 0x4828);
    iVar3 = *(idx_t *)(this + 0x4810);
    if (iVar3 != 0) {
      iVar14 = 0;
      do {
        piVar2 = values + iVar14;
        *piVar2 = *piVar2 - iVar8;
        iVar14 = iVar14 + 1;
      } while (iVar3 != iVar14);
      iVar8 = *(int *)(this + 0x4828);
    }
    BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteFor
              (values,(bool *)(this + 0x4010),bVar7,iVar8,iVar3,*(void **)(this + 0x4820));
    uVar17 = *(ulong *)(this + 0x4810);
    if ((uVar17 & 0x1f) != 0) {
      uVar10 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar17 & 0x1f);
      uVar17 = (uVar17 - uVar10) + 0x20;
    }
    *(ulong *)(this + 0x4818) = *(long *)(this + 0x4818) + (bVar7 * uVar17 >> 3) + 0xc;
  }
  else {
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}